

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext
          (RunContext *this,Ptr<const_Catch::IConfig> *config,
          Ptr<Catch::IStreamingReporter> *reporter)

{
  IConfig *pIVar1;
  IMutableContext *pIVar2;
  _func_int **pp_Var3;
  IStreamingReporter *pIVar4;
  Ptr<const_Catch::IConfig> *in_RSI;
  IResultCapture *in_RDI;
  string *in_stack_ffffffffffffff28;
  Totals *in_stack_ffffffffffffff30;
  AssertionResult *in_stack_ffffffffffffff40;
  string local_38 [40];
  Ptr<const_Catch::IConfig> *local_10;
  
  local_10 = in_RSI;
  IResultCapture::IResultCapture(in_RDI);
  IRunner::IRunner((IRunner *)(in_RDI + 1));
  in_RDI->_vptr_IResultCapture = (_func_int **)&PTR__RunContext_00220360;
  in_RDI[1]._vptr_IResultCapture = (_func_int **)&PTR__RunContext_002203c8;
  pIVar1 = Ptr<const_Catch::IConfig>::operator->(local_10);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_38);
  TestRunInfo::TestRunInfo((TestRunInfo *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_38);
  pIVar2 = getCurrentMutableContext();
  in_RDI[6]._vptr_IResultCapture = (_func_int **)pIVar2;
  in_RDI[7]._vptr_IResultCapture = (_func_int **)0x0;
  AssertionResult::AssertionResult(in_stack_ffffffffffffff40);
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff30,
             (Ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff28);
  Totals::Totals(in_stack_ffffffffffffff30);
  Ptr<Catch::IStreamingReporter>::Ptr
            ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff30,
             (Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff28);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1c95cc);
  pp_Var3 = (_func_int **)(**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x18))();
  in_RDI[0x28]._vptr_IResultCapture = pp_Var3;
  pp_Var3 = (_func_int **)(**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x10))();
  in_RDI[0x29]._vptr_IResultCapture = pp_Var3;
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x30))();
  AssertionInfo::AssertionInfo((AssertionInfo *)(in_RDI + 0x2b));
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::vector((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
            *)0x1c9687);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x40))(in_RDI[6]._vptr_IResultCapture,in_RDI + 1);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x48))
            (in_RDI[6]._vptr_IResultCapture,in_RDI + 0x1f);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x38))();
  pIVar4 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x24));
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar4,in_RDI + 2);
  return;
}

Assistant:

explicit RunContext( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> const& reporter )
        :   m_runInfo( config->name() ),
            m_context( getCurrentMutableContext() ),
            m_runningTest( NULL ),
            m_config( config ),
            m_reporter( reporter ),
            m_prevRunner( &m_context.getRunner() ),
            m_prevResultCapture( &m_context.getResultCapture() ),
            m_prevConfig( m_context.getConfig() )
        {
            m_context.setRunner( this );
            m_context.setConfig( m_config );
            m_context.setResultCapture( this );
            m_reporter->testRunStarting( m_runInfo );
        }